

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void PIT_FloorRaise(AActor *thing,FChangePosition *cpos)

{
  double oldz;
  double dVar1;
  double dVar2;
  player_t *ppVar3;
  int iVar4;
  double dVar5;
  
  oldz = (thing->__Pos).Z;
  dVar1 = thing->floorz;
  P_AdjustFloorCeil(thing,cpos);
  dVar5 = thing->floorz;
  if ((dVar1 == dVar5) && (!NAN(dVar1) && !NAN(dVar5))) {
    return;
  }
  dVar2 = (thing->__Pos).Z;
  if (dVar2 <= dVar5) {
    if (((thing->flags4).Value & 0x80) != 0) {
      cpos->nofit = true;
      return;
    }
    if (intersectors.Count != 0) {
      intersectors.Count = 0;
    }
  }
  else {
    if (((thing->flags).Value & 0x200) == 0) {
      return;
    }
    if (-1 < (int)(thing->flags6).Value) {
      return;
    }
    if (intersectors.Count != 0) {
      intersectors.Count = 0;
    }
    dVar5 = (dVar5 - dVar1) + dVar2;
  }
  (thing->__Pos).Z = dVar5;
  iVar4 = P_PushUp(thing,cpos);
  if (iVar4 == 1) {
    P_DoCrunch(thing,cpos);
  }
  else if (iVar4 == 2) {
    P_DoCrunch(thing,cpos);
    (thing->__Pos).Z = oldz;
    goto LAB_005176cb;
  }
  P_CheckFakeFloorTriggers(thing,oldz,false);
  AActor::UpdateRenderSectorList(thing);
LAB_005176cb:
  ppVar3 = thing->player;
  if ((ppVar3 != (player_t *)0x0) && (ppVar3->mo == (APlayerPawn *)thing)) {
    ppVar3->viewz = ((thing->__Pos).Z - oldz) + ppVar3->viewz;
  }
  return;
}

Assistant:

void PIT_FloorRaise(AActor *thing, FChangePosition *cpos)
{
	double oldfloorz = thing->floorz;
	double oldz = thing->Z();

	P_AdjustFloorCeil(thing, cpos);

	if (oldfloorz == thing->floorz) return;

	// Move things intersecting the floor up
	if (thing->Z() <= thing->floorz)
	{
		if (thing->flags4 & MF4_ACTLIKEBRIDGE)
		{
			cpos->nofit = true;
			return; // do not move bridge things
		}
		intersectors.Clear();
		thing->SetZ(thing->floorz);
	}
	else
	{
		if ((thing->flags & MF_NOGRAVITY) && (thing->flags6 & MF6_RELATIVETOFLOOR))
		{
			intersectors.Clear();
			thing->AddZ(-oldfloorz + thing->floorz);
		}
		else return;
	}
	switch (P_PushUp(thing, cpos))
	{
	default:
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
		break;
	case 1:
		P_DoCrunch(thing, cpos);
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
		break;
	case 2:
		P_DoCrunch(thing, cpos);
		thing->SetZ(oldz);
		break;
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}